

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O2

CURLcode Curl_xfer_write_resp(Curl_easy *data,char *buf,size_t blen,_Bool is_eos,_Bool *done)

{
  undefined1 *puVar1;
  _func_CURLcode_Curl_easy_ptr_char_ptr_size_t__Bool__Bool_ptr *p_Var2;
  CURLcode CVar3;
  
  p_Var2 = data->conn->handler->write_resp;
  if (p_Var2 == (_func_CURLcode_Curl_easy_ptr_char_ptr_size_t__Bool__Bool_ptr *)0x0) {
    CVar3 = CURLE_OK;
    if (blen != 0 || is_eos) {
      CVar3 = Curl_client_write(data,(uint)is_eos * 0x80 + 1,buf,blen);
    }
  }
  else {
    CVar3 = (*p_Var2)(data,buf,blen,is_eos,done);
  }
  if (is_eos && CVar3 == CURLE_OK) {
    puVar1 = &(data->req).field_0xbb;
    *puVar1 = *puVar1 | 0xc;
  }
  return CVar3;
}

Assistant:

CURLcode Curl_xfer_write_resp(struct Curl_easy *data,
                              char *buf, size_t blen,
                              bool is_eos, bool *done)
{
  CURLcode result = CURLE_OK;

  if(data->conn->handler->write_resp) {
    /* protocol handlers offering this function take full responsibility
     * for writing all received download data to the client. */
    result = data->conn->handler->write_resp(data, buf, blen, is_eos, done);
  }
  else {
    /* No special handling by protocol handler, write all received data
     * as BODY to the client. */
    if(blen || is_eos) {
      int cwtype = CLIENTWRITE_BODY;
      if(is_eos)
        cwtype |= CLIENTWRITE_EOS;

#ifndef CURL_DISABLE_POP3
      if(blen && data->conn->handler->protocol & PROTO_FAMILY_POP3) {
        result = data->req.ignorebody? CURLE_OK :
                 Curl_pop3_write(data, buf, blen);
      }
      else
#endif /* CURL_DISABLE_POP3 */
        result = Curl_client_write(data, cwtype, buf, blen);
    }
  }

  if(!result && is_eos) {
    /* If we wrote the EOS, we are definitely done */
    data->req.eos_written = TRUE;
    data->req.download_done = TRUE;
  }
  return result;
}